

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_fkhash_nlm.hpp
# Opt level: O0

void __thiscall
poplar::compact_fkhash_nlm<int,_16UL>::release_buf_(compact_fkhash_nlm<int,_16UL> *this)

{
  size_type sVar1;
  iterator __first;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  __array new_uptr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *__args;
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  *in_stack_ffffffffffffffd0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_ffffffffffffffd8;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> local_10 [2];
  
  this_00 = in_RDI + 1;
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this_00);
  in_RDI[2].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       in_RDI[2].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish + sVar1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this_00);
  __args = local_10;
  std::make_unique<unsigned_char[]>((size_t)in_stack_ffffffffffffffd8._M_current);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_RDI);
  __first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_RDI);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)this_00);
  std::
  copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*>
            ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__first._M_current,in_stack_ffffffffffffffd8,(uchar *)in_stack_ffffffffffffffd0);
  std::
  vector<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,std::allocator<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>>>
  ::emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>>
            (in_stack_ffffffffffffffd0,__args);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x144e97);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             in_stack_ffffffffffffffd0);
  return;
}

Assistant:

void release_buf_() {
        label_bytes_ += chunk_buf_.size();
        auto new_uptr = std::make_unique<uint8_t[]>(chunk_buf_.size());
        std::copy(chunk_buf_.begin(), chunk_buf_.end(), new_uptr.get());
        chunk_ptrs_.emplace_back(std::move(new_uptr));
        chunk_buf_.clear();
    }